

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

int json_serialize_to_buffer_r
              (JSON_Value *value,char *buf,int level,parson_bool_t is_pretty,char *num_buf)

{
  JSON_Value_Type JVar1;
  int iVar2;
  JSON_Array *array_00;
  size_t sVar3;
  JSON_Value *pJVar4;
  JSON_Object *object_00;
  char *pcVar5;
  size_t len_00;
  double dVar6;
  int local_90;
  int local_8c;
  int level_i_3;
  int level_i_2;
  int level_i_1;
  int level_i;
  size_t len;
  int written_total;
  int written;
  double num;
  size_t count;
  size_t i;
  JSON_Object *object;
  JSON_Array *array;
  JSON_Value *temp_value;
  char *string;
  char *key;
  char *num_buf_local;
  parson_bool_t is_pretty_local;
  int level_local;
  char *buf_local;
  JSON_Value *value_local;
  
  JVar1 = json_value_get_type(value);
  _is_pretty_local = buf;
  switch(JVar1) {
  default:
    value_local._4_4_ = -1;
    break;
  case 1:
    if (buf != (char *)0x0) {
      memcpy(buf,"null",4);
      buf[4] = '\0';
    }
    value_local._4_4_ = 4;
    break;
  case 2:
    pcVar5 = json_value_get_string(value);
    if (pcVar5 == (char *)0x0) {
      value_local._4_4_ = -1;
    }
    else {
      sVar3 = json_value_get_string_len(value);
      value_local._4_4_ = json_serialize_string(pcVar5,sVar3,buf);
      if (value_local._4_4_ < 0) {
        value_local._4_4_ = -1;
      }
    }
    break;
  case 3:
    dVar6 = json_value_get_number(value);
    key = num_buf;
    if (buf != (char *)0x0) {
      key = buf;
    }
    if (parson_number_serialization_function == (JSON_Number_Serialization_Function)0x0) {
      if (parson_float_format == (char *)0x0) {
        len._4_4_ = sprintf(key,"%1.17g",dVar6);
      }
      else {
        len._4_4_ = sprintf(key,parson_float_format,dVar6);
      }
    }
    else {
      len._4_4_ = (*parson_number_serialization_function)(dVar6,key);
    }
    if (len._4_4_ < 0) {
      value_local._4_4_ = -1;
    }
    else {
      value_local._4_4_ = len._4_4_;
    }
    break;
  case 4:
    object_00 = json_value_get_object(value);
    sVar3 = json_object_get_count(object_00);
    if (buf != (char *)0x0) {
      memcpy(buf,"{",1);
      buf[1] = '\0';
      _is_pretty_local = buf + 1;
    }
    len._0_4_ = 1;
    if ((sVar3 != 0) && (is_pretty != 0)) {
      if (_is_pretty_local != (char *)0x0) {
        memcpy(_is_pretty_local,"\n",1);
        _is_pretty_local[1] = '\0';
        _is_pretty_local = _is_pretty_local + 1;
      }
      len._0_4_ = 2;
    }
    for (count = 0; count < sVar3; count = count + 1) {
      pcVar5 = json_object_get_name(object_00,count);
      if (pcVar5 == (char *)0x0) {
        return -1;
      }
      if (is_pretty != 0) {
        for (local_8c = 0; local_8c < level + 1; local_8c = local_8c + 1) {
          if (_is_pretty_local != (char *)0x0) {
            memcpy(_is_pretty_local,"    ",4);
            _is_pretty_local[4] = '\0';
            _is_pretty_local = _is_pretty_local + 4;
          }
          len._0_4_ = (int)len + 4;
        }
      }
      len_00 = strlen(pcVar5);
      iVar2 = json_serialize_string(pcVar5,len_00,_is_pretty_local);
      if (iVar2 < 0) {
        return -1;
      }
      if (_is_pretty_local != (char *)0x0) {
        _is_pretty_local = _is_pretty_local + iVar2;
      }
      iVar2 = iVar2 + (int)len;
      if (_is_pretty_local != (char *)0x0) {
        memcpy(_is_pretty_local,":",1);
        _is_pretty_local[1] = '\0';
        _is_pretty_local = _is_pretty_local + 1;
      }
      len._0_4_ = iVar2 + 1;
      if (is_pretty != 0) {
        if (_is_pretty_local != (char *)0x0) {
          memcpy(_is_pretty_local," ",1);
          _is_pretty_local[1] = '\0';
          _is_pretty_local = _is_pretty_local + 1;
        }
        len._0_4_ = iVar2 + 2;
      }
      pJVar4 = json_object_get_value_at(object_00,count);
      iVar2 = json_serialize_to_buffer_r(pJVar4,_is_pretty_local,level + 1,is_pretty,num_buf);
      if (iVar2 < 0) {
        return -1;
      }
      if (_is_pretty_local != (char *)0x0) {
        _is_pretty_local = _is_pretty_local + iVar2;
      }
      len._0_4_ = iVar2 + (int)len;
      if (count < sVar3 - 1) {
        if (_is_pretty_local != (char *)0x0) {
          memcpy(_is_pretty_local,",",1);
          _is_pretty_local[1] = '\0';
          _is_pretty_local = _is_pretty_local + 1;
        }
        len._0_4_ = (int)len + 1;
      }
      if (is_pretty != 0) {
        if (_is_pretty_local != (char *)0x0) {
          memcpy(_is_pretty_local,"\n",1);
          _is_pretty_local[1] = '\0';
          _is_pretty_local = _is_pretty_local + 1;
        }
        len._0_4_ = (int)len + 1;
      }
    }
    if ((sVar3 != 0) && (is_pretty != 0)) {
      for (local_90 = 0; local_90 < level; local_90 = local_90 + 1) {
        if (_is_pretty_local != (char *)0x0) {
          memcpy(_is_pretty_local,"    ",4);
          _is_pretty_local[4] = '\0';
          _is_pretty_local = _is_pretty_local + 4;
        }
        len._0_4_ = (int)len + 4;
      }
    }
    if (_is_pretty_local != (char *)0x0) {
      memcpy(_is_pretty_local,"}",1);
      _is_pretty_local[1] = '\0';
    }
    value_local._4_4_ = (int)len + 1;
    break;
  case 5:
    array_00 = json_value_get_array(value);
    sVar3 = json_array_get_count(array_00);
    if (buf != (char *)0x0) {
      memcpy(buf,"[",1);
      buf[1] = '\0';
      _is_pretty_local = buf + 1;
    }
    len._0_4_ = 1;
    if ((sVar3 != 0) && (is_pretty != 0)) {
      if (_is_pretty_local != (char *)0x0) {
        memcpy(_is_pretty_local,"\n",1);
        _is_pretty_local[1] = '\0';
        _is_pretty_local = _is_pretty_local + 1;
      }
      len._0_4_ = 2;
    }
    for (count = 0; count < sVar3; count = count + 1) {
      if (is_pretty != 0) {
        for (level_i_2 = 0; level_i_2 < level + 1; level_i_2 = level_i_2 + 1) {
          if (_is_pretty_local != (char *)0x0) {
            memcpy(_is_pretty_local,"    ",4);
            _is_pretty_local[4] = '\0';
            _is_pretty_local = _is_pretty_local + 4;
          }
          len._0_4_ = (int)len + 4;
        }
      }
      pJVar4 = json_array_get_value(array_00,count);
      iVar2 = json_serialize_to_buffer_r(pJVar4,_is_pretty_local,level + 1,is_pretty,num_buf);
      if (iVar2 < 0) {
        return -1;
      }
      if (_is_pretty_local != (char *)0x0) {
        _is_pretty_local = _is_pretty_local + iVar2;
      }
      len._0_4_ = iVar2 + (int)len;
      if (count < sVar3 - 1) {
        if (_is_pretty_local != (char *)0x0) {
          memcpy(_is_pretty_local,",",1);
          _is_pretty_local[1] = '\0';
          _is_pretty_local = _is_pretty_local + 1;
        }
        len._0_4_ = (int)len + 1;
      }
      if (is_pretty != 0) {
        if (_is_pretty_local != (char *)0x0) {
          memcpy(_is_pretty_local,"\n",1);
          _is_pretty_local[1] = '\0';
          _is_pretty_local = _is_pretty_local + 1;
        }
        len._0_4_ = (int)len + 1;
      }
    }
    if ((sVar3 != 0) && (is_pretty != 0)) {
      for (level_i_3 = 0; level_i_3 < level; level_i_3 = level_i_3 + 1) {
        if (_is_pretty_local != (char *)0x0) {
          memcpy(_is_pretty_local,"    ",4);
          _is_pretty_local[4] = '\0';
          _is_pretty_local = _is_pretty_local + 4;
        }
        len._0_4_ = (int)len + 4;
      }
    }
    if (_is_pretty_local != (char *)0x0) {
      memcpy(_is_pretty_local,"]",1);
      _is_pretty_local[1] = '\0';
    }
    value_local._4_4_ = (int)len + 1;
    break;
  case 6:
    iVar2 = json_value_get_boolean(value);
    if (iVar2 == 0) {
      if (buf != (char *)0x0) {
        memcpy(buf,"false",5);
        buf[5] = '\0';
      }
      len._0_4_ = 5;
    }
    else {
      if (buf != (char *)0x0) {
        memcpy(buf,"true",4);
        buf[4] = '\0';
      }
      len._0_4_ = 4;
    }
    value_local._4_4_ = (int)len;
    break;
  case -1:
    value_local._4_4_ = -1;
  }
  return value_local._4_4_;
}

Assistant:

static int json_serialize_to_buffer_r(const JSON_Value *value, char *buf, int level, parson_bool_t is_pretty, char *num_buf)
{
    const char *key = NULL, *string = NULL;
    JSON_Value *temp_value = NULL;
    JSON_Array *array = NULL;
    JSON_Object *object = NULL;
    size_t i = 0, count = 0;
    double num = 0.0;
    int written = -1, written_total = 0;
    size_t len = 0;

    switch (json_value_get_type(value)) {
        case JSONArray:
            array = json_value_get_array(value);
            count = json_array_get_count(array);
            APPEND_STRING("[");
            if (count > 0 && is_pretty) {
                APPEND_STRING("\n");
            }
            for (i = 0; i < count; i++) {
                if (is_pretty) {
                    APPEND_INDENT(level+1);
                }
                temp_value = json_array_get_value(array, i);
                written = json_serialize_to_buffer_r(temp_value, buf, level+1, is_pretty, num_buf);
                if (written < 0) {
                    return -1;
                }
                if (buf != NULL) {
                    buf += written;
                }
                written_total += written;
                if (i < (count - 1)) {
                    APPEND_STRING(",");
                }
                if (is_pretty) {
                    APPEND_STRING("\n");
                }
            }
            if (count > 0 && is_pretty) {
                APPEND_INDENT(level);
            }
            APPEND_STRING("]");
            return written_total;
        case JSONObject:
            object = json_value_get_object(value);
            count  = json_object_get_count(object);
            APPEND_STRING("{");
            if (count > 0 && is_pretty) {
                APPEND_STRING("\n");
            }
            for (i = 0; i < count; i++) {
                key = json_object_get_name(object, i);
                if (key == NULL) {
                    return -1;
                }
                if (is_pretty) {
                    APPEND_INDENT(level+1);
                }
                /* We do not support key names with embedded \0 chars */
                written = json_serialize_string(key, strlen(key), buf);
                if (written < 0) {
                    return -1;
                }
                if (buf != NULL) {
                    buf += written;
                }
                written_total += written;
                APPEND_STRING(":");
                if (is_pretty) {
                    APPEND_STRING(" ");
                }
                temp_value = json_object_get_value_at(object, i);
                written = json_serialize_to_buffer_r(temp_value, buf, level+1, is_pretty, num_buf);
                if (written < 0) {
                    return -1;
                }
                if (buf != NULL) {
                    buf += written;
                }
                written_total += written;
                if (i < (count - 1)) {
                    APPEND_STRING(",");
                }
                if (is_pretty) {
                    APPEND_STRING("\n");
                }
            }
            if (count > 0 && is_pretty) {
                APPEND_INDENT(level);
            }
            APPEND_STRING("}");
            return written_total;
        case JSONString:
            string = json_value_get_string(value);
            if (string == NULL) {
                return -1;
            }
            len = json_value_get_string_len(value);
            written = json_serialize_string(string, len, buf);
            if (written < 0) {
                return -1;
            }
            if (buf != NULL) {
                buf += written;
            }
            written_total += written;
            return written_total;
        case JSONBoolean:
            if (json_value_get_boolean(value)) {
                APPEND_STRING("true");
            } else {
                APPEND_STRING("false");
            }
            return written_total;
        case JSONNumber:
            num = json_value_get_number(value);
            if (buf != NULL) {
                num_buf = buf;
            }
            if (parson_number_serialization_function) {
                written = parson_number_serialization_function(num, num_buf);
            } else if (parson_float_format) {
                written = sprintf(num_buf, parson_float_format, num);
            } else {
                written = sprintf(num_buf, PARSON_DEFAULT_FLOAT_FORMAT, num);
            }
            if (written < 0) {
                return -1;
            }
            if (buf != NULL) {
                buf += written;
            }
            written_total += written;
            return written_total;
        case JSONNull:
            APPEND_STRING("null");
            return written_total;
        case JSONError:
            return -1;
        default:
            return -1;
    }
}